

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonPrintf(int N,JsonString *p,char *zFormat,...)

{
  u64 uVar1;
  char *pcVar2;
  char in_AL;
  int iVar3;
  size_t sVar4;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_118;
  sqlite3_str local_f8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if ((p->nAlloc <= (long)N + p->nUsed) && (iVar3 = jsonGrow(p,N), iVar3 != 0)) {
    return;
  }
  local_118.reg_save_area = local_d8;
  local_118.overflow_arg_area = &ap[0].overflow_arg_area;
  local_118.gp_offset = 0x18;
  local_118.fp_offset = 0x30;
  if (0 < N) {
    uVar1 = p->nUsed;
    pcVar2 = p->zBuf;
    local_f8.db = (sqlite3 *)0x0;
    local_f8.mxAlloc = 0;
    local_f8.nChar = 0;
    local_f8.accError = '\0';
    local_f8.printfFlags = '\0';
    local_f8.zText = pcVar2 + uVar1;
    local_f8.nAlloc = N;
    sqlite3_str_vappendf(&local_f8,zFormat,&local_118);
    (pcVar2 + uVar1)[(ulong)local_f8._20_8_ >> 0x20] = '\0';
  }
  uVar1 = p->nUsed;
  sVar4 = strlen(p->zBuf + uVar1);
  p->nUsed = (long)(int)sVar4 + uVar1;
  return;
}

Assistant:

static void jsonPrintf(int N, JsonString *p, const char *zFormat, ...){
  va_list ap;
  if( (p->nUsed + N >= p->nAlloc) && jsonGrow(p, N) ) return;
  va_start(ap, zFormat);
  sqlite3_vsnprintf(N, p->zBuf+p->nUsed, zFormat, ap);
  va_end(ap);
  p->nUsed += (int)strlen(p->zBuf+p->nUsed);
}